

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_hardenfist(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  AFFECT_DATA AStack_88;
  
  bVar1 = is_affected(ch,sn);
  if (bVar1) {
    send_to_char("Your fists are already as hard as granite.\n\r",ch);
    return;
  }
  init_affect(&AStack_88);
  AStack_88.where = 0;
  AStack_88.type = (short)sn;
  AStack_88.aftype = 0;
  AStack_88.duration = (short)(level / 3);
  AStack_88.location = 0;
  AStack_88.modifier = 0;
  AStack_88.owner = (CHAR_DATA *)0x0;
  AStack_88.end_fun = (AFF_FUN *)0x0;
  AStack_88.level = (short)level;
  new_affect_to_char(ch,&AStack_88);
  act("$n clenches $s fists tightly as the flesh seems to take on a stony pallor.",ch,(void *)0x0,
      (void *)0x0,0);
  act("As you clench your fist, it becomes as hard as granite.",ch,(void *)0x0,(void *)0x0,3);
  return;
}

Assistant:

void spell_hardenfist(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (!is_affected(ch, sn))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = sn;
		af.aftype = AFT_SPELL;
		af.level = level;
		af.duration = level / 3;
		af.location = 0;
		af.modifier = 0;
		af.owner = nullptr;
		af.end_fun = nullptr;
		new_affect_to_char(ch, &af);

		act("$n clenches $s fists tightly as the flesh seems to take on a stony pallor.", ch, 0, 0, TO_ROOM);
		act("As you clench your fist, it becomes as hard as granite.", ch, 0, 0, TO_CHAR);
	}
	else
	{
		send_to_char("Your fists are already as hard as granite.\n\r", ch);
	}
}